

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O2

string * fs_longname_abi_cxx11_(string *__return_storage_ptr__,string_view in)

{
  string_view fname;
  error_code local_28;
  
  local_28._M_cat = (error_category *)std::_V2::generic_category();
  local_28._M_value = 0x26;
  fname._M_str = "fs_longname";
  fname._M_len = 0xb;
  fs_print_error(in,fname,&local_28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_longname(std::string_view in)
{
// https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getlongpathnamea
// the path must exist

  std::error_code ec;

#if defined(_WIN32) || defined(__CYGWIN__)
  std::string out(fs_get_max_path(), '\0');
// size does not include null terminator

  if(auto L = GetLongPathNameA(in.data(), out.data(), static_cast<DWORD>(out.size()));
      L > 0 && L < out.length()){
    out.resize(L);
    return out;
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(in, __func__, ec);
  return {};
}